

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::RandomHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (this->rnd_).seed_;
  uVar2 = 1;
  do {
    uVar4 = (uint)((ulong)uVar3 * 0x41a7) & 0x7fffffff;
    iVar1 = (int)((ulong)uVar3 * 0x41a7 >> 0x1f);
    uVar5 = iVar1 + uVar4;
    uVar3 = iVar1 + uVar4 + 0x80000001;
    if (-1 < (int)uVar5) {
      uVar3 = uVar5;
    }
    if ((uVar3 & 3) != 0) goto LAB_00112a85;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0xc);
  uVar2 = 0xc;
LAB_00112a85:
  (this->rnd_).seed_ = uVar3;
  if (uVar2 < 0xd) {
    return uVar2;
  }
  __assert_fail("height <= kMaxHeight",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0xfa,
                "int leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::RandomHeight() [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

int SkipList<Key, Comparator>::RandomHeight() {
  // Increase height with probability 1 in kBranching
  static const unsigned int kBranching = 4;
  int height = 1;
  while (height < kMaxHeight && ((rnd_.Next() % kBranching) == 0)) {
    height++;
  }
  assert(height > 0);
  assert(height <= kMaxHeight);
  return height;
}